

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O3

filename_t * spdlog::details::os::dir_name(filename_t *__return_storage_ptr__,filename_t *path)

{
  size_type __n;
  
  __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        find_last_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)path,"/",
                     0xffffffffffffffff,1);
  if (__n == 0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (__return_storage_ptr__,path,0,__n);
  }
  return __return_storage_ptr__;
}

Assistant:

SPDLOG_INLINE filename_t dir_name(const filename_t &path) {
    auto pos = path.find_last_of(folder_seps_filename);
    return pos != filename_t::npos ? path.substr(0, pos) : filename_t{};
}